

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnLocalTee(SharedValidator *this,Location *loc,Var *param_2)

{
  Result RVar1;
  Result RVar2;
  Enum EVar3;
  Type type;
  Var local_70;
  
  RVar1 = CheckInstr(this,(Opcode)0x1d,loc);
  if (RVar1.enum_ == Error) {
    EVar3 = Error;
  }
  else {
    type.enum_ = Any;
    type.type_index_ = 0;
    Var::Var(&local_70,param_2);
    RVar1 = CheckLocalIndex(this,&local_70,&type);
    Var::~Var(&local_70);
    RVar2 = TypeChecker::OnLocalTee(&this->typechecker_,type);
    EVar3 = (Enum)(RVar2.enum_ == Error || RVar1.enum_ == Error);
  }
  return (Result)EVar3;
}

Assistant:

Result SharedValidator::OnLocalTee(const Location& loc, Var local_var) {
  CHECK_RESULT(CheckInstr(Opcode::LocalTee, loc));
  Result result = Result::Ok;
  Type type = Type::Any;
  result |= CheckLocalIndex(local_var, &type);
  result |= typechecker_.OnLocalTee(type);
  return result;
}